

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version_number.cpp
# Opt level: O1

bool ON_VersionNumberIsValid(uint version_number)

{
  bool bVar1;
  uint uVar2;
  uint version_day_of_month;
  uint version_month;
  uint version_year;
  uint version_branch;
  uint version_minor;
  uint version_major;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  uVar2 = ON_VersionNumberConstruct(1,0,2000,1,1,0);
  bVar1 = uVar2 <= version_number;
  if (uVar2 <= version_number) {
    local_1c = 0;
    local_20 = 0;
    local_24 = 0;
    local_28 = 0;
    local_2c = 0;
    local_30 = 0;
    bVar1 = ON_VersionNumberParse
                      (version_number,&local_1c,&local_20,&local_28,&local_2c,&local_30,&local_24);
    if (bVar1) {
      uVar2 = ON_VersionNumberConstruct(local_1c,local_20,local_28,local_2c,local_30,local_24);
      bVar1 = bVar1 && uVar2 == version_number;
    }
  }
  return bVar1;
}

Assistant:

bool ON_VersionNumberIsValid(
  unsigned int version_number
  )
{
  bool rc = ( version_number >= ON_VersionNumberMinimum(1) );
  if (rc)
  {
    unsigned int version_major = 0;
    unsigned int version_minor = 0;
    unsigned int version_branch = 0;
    unsigned int version_year = 0;
    unsigned int version_month = 0;
    unsigned int version_day_of_month = 0;
    rc = ON_VersionNumberParse(
      version_number,
      &version_major,
      &version_minor,
      &version_year,
      &version_month,
      &version_day_of_month,
      &version_branch
      );
    if (rc)
    {
      const unsigned int v = ON_VersionNumberConstruct(version_major,version_minor,version_year,version_month,version_day_of_month,version_branch);
      if ( v != version_number )
        rc = false;
    }
  }

  return rc;
}